

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Song *pSVar3;
  bool bVar4;
  istream *piVar5;
  ulong *puVar6;
  long lVar7;
  ostream *poVar8;
  out_of_range *this;
  ulong *puVar9;
  Song *extraout_RDX;
  Song *extraout_RDX_00;
  Song *extraout_RDX_01;
  Song *extraout_RDX_02;
  Song *extraout_RDX_03;
  Song *extraout_RDX_04;
  Song *extraout_RDX_05;
  Song *extraout_RDX_06;
  Song *pSVar10;
  Song *extraout_RDX_07;
  Song *extraout_RDX_08;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  int count;
  int n;
  string artist;
  string title;
  Song tmp;
  string local_b8;
  string local_98;
  Song s;
  
  std::istream::operator>>((istream *)&std::cin,&n);
  iVar13 = 0;
  while( true ) {
    if (n <= iVar13) break;
    title._M_dataplus._M_p = (pointer)&title.field_2;
    title._M_string_length = 0;
    title.field_2._M_local_buf[0] = '\0';
    artist._M_dataplus._M_p = (pointer)&artist.field_2;
    artist._M_string_length = 0;
    artist.field_2._M_local_buf[0] = '\0';
    piVar5 = std::operator>>((istream *)&std::cin,(string *)&title);
    piVar5 = std::operator>>(piVar5,(string *)&artist);
    std::istream::operator>>(piVar5,&count);
    std::__cxx11::string::string((string *)&local_98,(string *)&title);
    std::__cxx11::string::string((string *)&local_b8,(string *)&artist);
    Song::Song(&s,&local_98,&local_b8,count);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    sVar14 = pq1.mSize;
    sVar17 = pq1.mCap;
    pSVar10 = pq1.mData;
    uVar12 = pq1.mCap;
    if (pq1.mCap < pq1.mSize + 1) {
      uVar12 = pq1.mCap * 2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar12;
      uVar11 = SUB168(auVar1 * ZEXT816(0x48),0) | 8;
      if (SUB168(auVar1 * ZEXT816(0x48),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar11);
      *puVar6 = uVar12;
      if (uVar12 != 0) {
        lVar7 = sVar17 * 0x90;
        puVar9 = puVar6 + 7;
        do {
          puVar9[-6] = (ulong)(puVar9 + -4);
          puVar9[-5] = 0;
          *(undefined1 *)(puVar9 + -4) = 0;
          puVar9[-2] = (ulong)puVar9;
          puVar9[-1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar9 = puVar9 + 9;
          lVar7 = lVar7 + -0x48;
        } while (lVar7 != 0);
      }
      pSVar10 = (Song *)(puVar6 + 1);
      lVar7 = 0;
      for (uVar11 = 0; pSVar3 = pq1.mData, uVar11 < sVar14; uVar11 = uVar11 + 1) {
        Song::operator=((Song *)((long)&(pSVar10->artist)._M_dataplus._M_p + lVar7),
                        (Song *)((long)&((pq1.mData)->artist)._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + 0x48;
        sVar14 = pq1.mSize;
      }
      if (pq1.mData != (Song *)0x0) {
        lVar7 = *(long *)&pq1.mData[-1].count;
        if (lVar7 != 0) {
          lVar16 = lVar7 * 0x48;
          do {
            Song::~Song((Song *)((long)&pSVar3[-1].artist._M_dataplus._M_p + lVar16));
            lVar16 = lVar16 + -0x48;
          } while (lVar16 != 0);
        }
        operator_delete__(&pSVar3[-1].count,lVar7 * 0x48 + 8);
        sVar14 = pq1.mSize;
      }
    }
    pq1.mCap = uVar12;
    pq1.mData = pSVar10;
    Song::operator=(pq1.mData + sVar14,&s);
    sVar17 = pq1.mSize;
    pSVar10 = pq1.mData + pq1.mSize;
    pq1.mSize = pq1.mSize + 1;
    Song::Song(&tmp,pSVar10);
    pSVar10 = extraout_RDX;
    while (sVar17 != 0) {
      uVar12 = sVar17 - 1 >> 1;
      bVar4 = CP::
              priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
              ::anon_class_1_0_00000001_for_mLess::operator()
                        ((anon_class_1_0_00000001_for_mLess *)&tmp,pq1.mData + uVar12,pSVar10);
      if (bVar4) break;
      Song::operator=(pq1.mData + sVar17,pq1.mData + uVar12);
      pSVar10 = extraout_RDX_00;
      sVar17 = uVar12;
    }
    Song::operator=(pq1.mData + sVar17,&tmp);
    Song::~Song(&tmp);
    sVar14 = pq2.mSize;
    sVar17 = pq2.mCap;
    pSVar10 = pq2.mData;
    uVar12 = pq2.mCap;
    if (pq2.mCap < pq2.mSize + 1) {
      uVar12 = pq2.mCap * 2;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar12;
      uVar11 = SUB168(auVar2 * ZEXT816(0x48),0) | 8;
      if (SUB168(auVar2 * ZEXT816(0x48),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar11);
      *puVar6 = uVar12;
      if (uVar12 != 0) {
        lVar7 = sVar17 * 0x90;
        puVar9 = puVar6 + 7;
        do {
          puVar9[-6] = (ulong)(puVar9 + -4);
          puVar9[-5] = 0;
          *(undefined1 *)(puVar9 + -4) = 0;
          puVar9[-2] = (ulong)puVar9;
          puVar9[-1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar9 = puVar9 + 9;
          lVar7 = lVar7 + -0x48;
        } while (lVar7 != 0);
      }
      pSVar10 = (Song *)(puVar6 + 1);
      lVar7 = 0;
      for (uVar11 = 0; pSVar3 = pq2.mData, uVar11 < sVar14; uVar11 = uVar11 + 1) {
        Song::operator=((Song *)((long)&(pSVar10->artist)._M_dataplus._M_p + lVar7),
                        (Song *)((long)&((pq2.mData)->artist)._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + 0x48;
        sVar14 = pq2.mSize;
      }
      if (pq2.mData != (Song *)0x0) {
        lVar7 = *(long *)&pq2.mData[-1].count;
        if (lVar7 != 0) {
          lVar16 = lVar7 * 0x48;
          do {
            Song::~Song((Song *)((long)&pSVar3[-1].artist._M_dataplus._M_p + lVar16));
            lVar16 = lVar16 + -0x48;
          } while (lVar16 != 0);
        }
        operator_delete__(&pSVar3[-1].count,lVar7 * 0x48 + 8);
        sVar14 = pq2.mSize;
      }
    }
    pq2.mCap = uVar12;
    pq2.mData = pSVar10;
    Song::operator=(pq2.mData + sVar14,&s);
    sVar17 = pq2.mSize;
    pSVar10 = pq2.mData + pq2.mSize;
    pq2.mSize = pq2.mSize + 1;
    Song::Song(&tmp,pSVar10);
    pSVar10 = extraout_RDX_01;
    while (sVar17 != 0) {
      uVar12 = sVar17 - 1 >> 1;
      bVar4 = CP::
              priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
              ::anon_class_1_0_00000001_for_mLess::operator()
                        ((anon_class_1_0_00000001_for_mLess *)&tmp,pq2.mData + uVar12,pSVar10);
      if (bVar4) break;
      Song::operator=(pq2.mData + sVar17,pq2.mData + uVar12);
      pSVar10 = extraout_RDX_02;
      sVar17 = uVar12;
    }
    Song::operator=(pq2.mData + sVar17,&tmp);
    Song::~Song(&tmp);
    Song::~Song(&s);
    std::__cxx11::string::~string((string *)&artist);
    std::__cxx11::string::~string((string *)&title);
    iVar13 = iVar13 + 1;
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"--- Order By Artist-Title-count ---");
  std::endl<char,std::char_traits<char>>(poVar8);
  do {
    if (pq1.mSize == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"--- Order By count-Artist-Title ---");
      std::endl<char,std::char_traits<char>>(poVar8);
      while( true ) {
        if (pq2.mSize == 0) {
          return 0;
        }
        poVar8 = operator<<((ostream *)&std::cout,pq2.mData);
        std::endl<char,std::char_traits<char>>(poVar8);
        if (pq2.mSize == 0) break;
        Song::operator=(pq2.mData,pq2.mData + (pq2.mSize - 1));
        pq2.mSize = pq2.mSize - 1;
        Song::Song(&tmp,pq2.mData);
        pSVar10 = extraout_RDX_06;
        uVar12 = 0;
        while (uVar11 = uVar12 * 2 + 1, uVar11 < pq2.mSize) {
          uVar18 = uVar12 * 2 + 2;
          uVar15 = uVar11;
          if ((uVar18 < pq2.mSize) &&
             (bVar4 = CP::
                      priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
                      ::anon_class_1_0_00000001_for_mLess::operator()
                                ((anon_class_1_0_00000001_for_mLess *)(pq2.mData + uVar11),
                                 pq2.mData + uVar18,pSVar10), pSVar10 = extraout_RDX_07,
             uVar15 = uVar18, !bVar4)) {
            uVar15 = uVar11;
          }
          bVar4 = CP::
                  priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
                  ::anon_class_1_0_00000001_for_mLess::operator()
                            ((anon_class_1_0_00000001_for_mLess *)(pq2.mData + uVar15),&tmp,pSVar10)
          ;
          if (bVar4) break;
          Song::operator=(pq2.mData + uVar12,pq2.mData + uVar15);
          pSVar10 = extraout_RDX_08;
          uVar12 = uVar15;
        }
        Song::operator=(pq2.mData + uVar12,&tmp);
        Song::~Song(&tmp);
      }
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"index of out range");
LAB_00101b72:
      __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    poVar8 = operator<<((ostream *)&std::cout,pq1.mData);
    std::endl<char,std::char_traits<char>>(poVar8);
    if (pq1.mSize == 0) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"index of out range");
      goto LAB_00101b72;
    }
    Song::operator=(pq1.mData,pq1.mData + (pq1.mSize - 1));
    pq1.mSize = pq1.mSize - 1;
    Song::Song(&tmp,pq1.mData);
    pSVar10 = extraout_RDX_03;
    uVar12 = 0;
    while (uVar11 = uVar12 * 2 + 1, uVar11 < pq1.mSize) {
      uVar18 = uVar12 * 2 + 2;
      uVar15 = uVar11;
      if ((uVar18 < pq1.mSize) &&
         (bVar4 = CP::
                  priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
                  ::anon_class_1_0_00000001_for_mLess::operator()
                            ((anon_class_1_0_00000001_for_mLess *)(pq1.mData + uVar11),
                             pq1.mData + uVar18,pSVar10), pSVar10 = extraout_RDX_04, uVar15 = uVar18
         , !bVar4)) {
        uVar15 = uVar11;
      }
      bVar4 = CP::
              priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
              ::anon_class_1_0_00000001_for_mLess::operator()
                        ((anon_class_1_0_00000001_for_mLess *)(pq1.mData + uVar15),&tmp,pSVar10);
      if (bVar4) break;
      Song::operator=(pq1.mData + uVar12,pq1.mData + uVar15);
      pSVar10 = extraout_RDX_05;
      uVar12 = uVar15;
    }
    Song::operator=(pq1.mData + uVar12,&tmp);
    Song::~Song(&tmp);
  } while( true );
}

Assistant:

int main() {
  int n;
  cin >> n;
  for (int i = 0;i < n;i++) {
    string title,artist;
    int count;
    cin >> title >> artist >> count;
    Song s(title,artist,count);
    pq1.push(s);
    pq2.push(s);
  }

  cout << "--- Order By Artist-Title-count ---" << endl;
  while (pq1.empty() == false) {
    cout << pq1.top() << endl;
    pq1.pop();
  }

  cout << "--- Order By count-Artist-Title ---" << endl;
  while (pq2.empty() == false) {
    cout << pq2.top() << endl;
    pq2.pop();
  }
}